

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

charcount_t __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::UpdateLine
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,int32 *line,EncodedCharPtr start,
          EncodedCharPtr last,charcount_t ichStart,charcount_t ichEnd)

{
  OLECHAR OVar1;
  UTF8EncodingPolicyBase<false> *this_00;
  uint uVar2;
  EncodedCharPtr local_48;
  EncodedCharPtr p;
  int local_38;
  charcount_t local_34;
  
  local_38 = *line;
  this_00 = &this->super_UTF8EncodingPolicyBase<false>;
  local_48 = start;
  p = (EncodedCharPtr)line;
  local_34 = ichStart;
  while (uVar2 = ichStart, uVar2 < ichEnd) {
    ichStart = uVar2 + 1;
    OVar1 = UTF8EncodingPolicyBase<false>::ReadFull<false>(this_00,&local_48,last);
    if ((ushort)OVar1 - 0x2028 < 2) goto LAB_00d55254;
    if (OVar1 == L'\0') break;
    if (OVar1 == L'\n') goto LAB_00d55254;
    if (OVar1 == L'\r') {
      OVar1 = UTF8EncodingPolicyBase<false>::PeekFull(this_00,local_48,last);
      if (OVar1 == L'\n') {
        ichStart = uVar2 + 2;
        UTF8EncodingPolicyBase<false>::ReadFull<false>(this_00,&local_48,last);
      }
LAB_00d55254:
      local_38 = local_38 + 1;
      local_34 = ichStart;
    }
  }
  *(int *)p = local_38;
  return local_34;
}

Assistant:

charcount_t Scanner<EncodingPolicy>::UpdateLine(int32 &line, EncodedCharPtr start, EncodedCharPtr last, charcount_t ichStart, charcount_t ichEnd)
{
    EncodedCharPtr p = start;
    charcount_t ich = ichStart;
    int32 current = line;
    charcount_t lastStart = ichStart;

    while (ich < ichEnd)
    {
        ich++;
        switch (this->template ReadFull<false>(p, last))
        {
        case kchRET:
            if (this->PeekFull(p, last) == kchNWL)
            {
                ich++;
                this->template ReadFull<false>(p, last);
            }
            // fall-through

        case kchNWL:
        case kchLS:
        case kchPS:
            current++;
            lastStart = ich;
            break;

        case kchNUL:
            goto done;
        }
    }

done:
    line = current;
    return lastStart;
}